

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_create_meta(lyd_node *parent,lyd_meta **meta,lys_module *mod,char *name,size_t name_len,
                      char *value,size_t value_len,ly_bool is_utf8,ly_bool store_only,
                      ly_bool *dynamic,LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,
                      lysc_node *ctx_node,ly_bool clear_dflt,ly_bool *incomplete)

{
  ly_ctx *meta_00;
  ly_ctx *local_80;
  lyd_meta *last;
  lyd_meta *mt;
  lysc_type *ant_type;
  lysc_ext_instance *ant;
  char *pcStack_58;
  LY_ERR ret;
  char *value_local;
  size_t name_len_local;
  char *name_local;
  lys_module *mod_local;
  lyd_meta **meta_local;
  lyd_node *parent_local;
  
  ant._4_4_ = 0;
  ant_type = (lysc_type *)0x0;
  pcStack_58 = value;
  value_local = (char *)name_len;
  name_len_local = (size_t)name;
  name_local = (char *)mod;
  mod_local = (lys_module *)meta;
  meta_local = (lyd_meta **)parent;
  if (((parent != (lyd_node *)0x0) || (meta != (lyd_meta **)0x0)) && (mod != (lys_module *)0x0)) {
    ant_type = (lysc_type *)lyd_get_meta_annotation(mod,name,name_len);
    if ((lysc_ext_instance *)ant_type == (lysc_ext_instance *)0x0) {
      ly_vlog(*(ly_ctx **)name_local,(char *)0x0,LYVE_REFERENCE,
              "Annotation definition for attribute \"%s:%.*s\" not found.",
              *(undefined8 *)(name_local + 8),(ulong)value_local & 0xffffffff,name_len_local);
      ant._4_4_ = LY_EINVAL;
    }
    else {
      meta_00 = (ly_ctx *)calloc(1,0x48);
      if (meta_00 == (ly_ctx *)0x0) {
        ly_log(*(ly_ctx **)name_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyd_create_meta");
        ant._4_4_ = LY_EMEM;
      }
      else {
        (meta_00->dict).hash_tab = (ly_ht *)meta_local;
        *(lysc_type **)((long)&(meta_00->dict).lock + 8) = ant_type;
        lyplg_ext_get_storage((lysc_ext_instance *)ant_type,0x2e0000,8,&mt);
        ant._4_4_ = lyd_value_store(*(ly_ctx **)name_local,
                                    (lyd_value *)&(meta_00->dict).lock.__data.__list,(lysc_type *)mt
                                    ,pcStack_58,value_len,is_utf8,store_only,dynamic,format,
                                    prefix_data,hints,ctx_node,incomplete);
        if (ant._4_4_ == LY_SUCCESS) {
          ant._4_4_ = lydict_insert(*(ly_ctx **)name_local,(char *)name_len_local,
                                    (size_t)value_local,
                                    (char **)((long)&(meta_00->dict).lock + 0x10));
          if (ant._4_4_ == LY_SUCCESS) {
            if (meta_local == (lyd_meta **)0x0) {
              if (mod_local->ctx != (ly_ctx *)0x0) {
                for (local_80 = mod_local->ctx; (local_80->dict).lock.__align != 0;
                    local_80 = (ly_ctx *)(local_80->dict).lock.__align) {
                }
                *(ly_ctx **)&(local_80->dict).lock = meta_00;
              }
            }
            else {
              lyd_insert_meta((lyd_node *)meta_local,(lyd_meta *)meta_00,clear_dflt);
            }
            if (mod_local != (lys_module *)0x0) {
              mod_local->ctx = meta_00;
            }
          }
          else {
            free(meta_00);
          }
        }
        else {
          free(meta_00);
        }
      }
    }
    return ant._4_4_;
  }
  __assert_fail("(parent || meta) && mod",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                ,0x549,
                "LY_ERR lyd_create_meta(struct lyd_node *, struct lyd_meta **, const struct lys_module *, const char *, size_t, const char *, size_t, ly_bool, ly_bool, ly_bool *, LY_VALUE_FORMAT, void *, uint32_t, const struct lysc_node *, ly_bool, ly_bool *)"
               );
}

Assistant:

LY_ERR
lyd_create_meta(struct lyd_node *parent, struct lyd_meta **meta, const struct lys_module *mod, const char *name,
        size_t name_len, const char *value, size_t value_len, ly_bool is_utf8, ly_bool store_only, ly_bool *dynamic,
        LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints, const struct lysc_node *ctx_node, ly_bool clear_dflt,
        ly_bool *incomplete)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_ext_instance *ant = NULL;
    const struct lysc_type *ant_type;
    struct lyd_meta *mt, *last;

    assert((parent || meta) && mod);

    ant = lyd_get_meta_annotation(mod, name, name_len);
    if (!ant) {
        /* attribute is not defined as a metadata annotation (RFC 7952) */
        LOGVAL(mod->ctx, LYVE_REFERENCE, "Annotation definition for attribute \"%s:%.*s\" not found.",
                mod->name, (int)name_len, name);
        ret = LY_EINVAL;
        goto cleanup;
    }

    mt = calloc(1, sizeof *mt);
    LY_CHECK_ERR_GOTO(!mt, LOGMEM(mod->ctx); ret = LY_EMEM, cleanup);
    mt->parent = parent;
    mt->annotation = ant;
    lyplg_ext_get_storage(ant, LY_STMT_TYPE, sizeof ant_type, (const void **)&ant_type);
    ret = lyd_value_store(mod->ctx, &mt->value, ant_type, value, value_len, is_utf8, store_only, dynamic, format, prefix_data, hints,
            ctx_node, incomplete);
    LY_CHECK_ERR_GOTO(ret, free(mt), cleanup);
    ret = lydict_insert(mod->ctx, name, name_len, &mt->name);
    LY_CHECK_ERR_GOTO(ret, free(mt), cleanup);

    /* insert as the last attribute */
    if (parent) {
        lyd_insert_meta(parent, mt, clear_dflt);
    } else if (*meta) {
        for (last = *meta; last->next; last = last->next) {}
        last->next = mt;
    }

    if (meta) {
        *meta = mt;
    }

cleanup:
    return ret;
}